

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O0

_Bool smtp_endofresp(Curl_easy *data,connectdata *conn,char *line,size_t len,int *resp)

{
  int iVar1;
  long slnum;
  char local_47 [6];
  byte local_41;
  char tmpline [6];
  anon_union_280_10_9f9d5394_for_proto *paStack_40;
  _Bool result;
  smtp_conn *smtpc;
  int *resp_local;
  size_t len_local;
  char *line_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  paStack_40 = &conn->proto;
  local_41 = 0;
  if (((((len < 4) || (*line < '0')) || ('9' < *line)) || ((line[1] < '0' || ('9' < line[1])))) ||
     ((line[2] < '0' || ('9' < line[2])))) {
    data_local._7_1_ = false;
  }
  else {
    if ((line[3] == ' ') || (len == 5)) {
      local_41 = 1;
      memset(local_47,0,6);
      iVar1 = 3;
      if (len == 5) {
        iVar1 = 5;
      }
      memcpy(local_47,line,(long)iVar1);
      slnum = strtol(local_47,(char **)0x0,10);
      iVar1 = curlx_sltosi(slnum);
      *resp = iVar1;
      if (*resp == 1) {
        *resp = 0;
      }
    }
    else if ((line[3] == '-') &&
            (((conn->proto).smtpc.state == SMTP_EHLO || ((conn->proto).smtpc.state == SMTP_COMMAND))
            )) {
      local_41 = 1;
      *resp = 1;
    }
    data_local._7_1_ = (_Bool)(local_41 & 1);
  }
  return data_local._7_1_;
}

Assistant:

static bool smtp_endofresp(struct Curl_easy *data, struct connectdata *conn,
                           char *line, size_t len, int *resp)
{
  struct smtp_conn *smtpc = &conn->proto.smtpc;
  bool result = FALSE;
  (void)data;

  /* Nothing for us */
  if(len < 4 || !ISDIGIT(line[0]) || !ISDIGIT(line[1]) || !ISDIGIT(line[2]))
    return FALSE;

  /* Do we have a command response? This should be the response code followed
     by a space and optionally some text as per RFC-5321 and as outlined in
     Section 4. Examples of RFC-4954 but some email servers ignore this and
     only send the response code instead as per Section 4.2. */
  if(line[3] == ' ' || len == 5) {
    char tmpline[6];

    result = TRUE;
    memset(tmpline, '\0', sizeof(tmpline));
    memcpy(tmpline, line, (len == 5 ? 5 : 3));
    *resp = curlx_sltosi(strtol(tmpline, NULL, 10));

    /* Make sure real server never sends internal value */
    if(*resp == 1)
      *resp = 0;
  }
  /* Do we have a multiline (continuation) response? */
  else if(line[3] == '-' &&
          (smtpc->state == SMTP_EHLO || smtpc->state == SMTP_COMMAND)) {
    result = TRUE;
    *resp = 1;  /* Internal response code */
  }

  return result;
}